

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>::
emplaceRealloc<slang::analysis::ClockInference::ExpansionInstance>
          (SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance> *this,pointer pos,
          ExpansionInstance *args)

{
  ulong uVar1;
  pointer p;
  TimingControl *pTVar2;
  undefined7 uVar3;
  pointer pEVar4;
  long lVar5;
  pointer pEVar6;
  pointer pEVar7;
  long lVar8;
  size_type sVar9;
  ulong uVar10;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar1 = this->cap;
  if (uVar10 < uVar1 * 2) {
    uVar10 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar10 = 0x555555555555555;
  }
  lVar8 = (long)pos - (long)this->data_;
  pEVar4 = (pointer)operator_new(uVar10 * 0x18);
  *(undefined8 *)((long)pEVar4 + lVar8 + 0x10) = *(undefined8 *)&args->hasInferredClockArg;
  pTVar2 = args->clock;
  *(undefined8 *)((long)pEVar4 + lVar8) = args->expr;
  ((undefined8 *)((long)pEVar4 + lVar8))[1] = pTVar2;
  p = this->data_;
  sVar9 = this->len;
  lVar5 = (long)p + (sVar9 * 0x18 - (long)pos);
  pEVar6 = p;
  pEVar7 = pEVar4;
  if (lVar5 == 0) {
    pEVar6 = pEVar4;
    pEVar7 = p;
    if (sVar9 != 0) {
      do {
        uVar3 = *(undefined7 *)&pEVar7->field_0x11;
        pEVar6->hasInferredClockArg = pEVar7->hasInferredClockArg;
        *(undefined7 *)&pEVar6->field_0x11 = uVar3;
        pTVar2 = pEVar7->clock;
        pEVar6->expr = pEVar7->expr;
        pEVar6->clock = pTVar2;
        pEVar7 = pEVar7 + 1;
        pEVar6 = pEVar6 + 1;
      } while (pEVar7 != pos);
    }
  }
  else {
    for (; pEVar6 != pos; pEVar6 = pEVar6 + 1) {
      uVar3 = *(undefined7 *)&pEVar6->field_0x11;
      pEVar7->hasInferredClockArg = pEVar6->hasInferredClockArg;
      *(undefined7 *)&pEVar7->field_0x11 = uVar3;
      pTVar2 = pEVar6->clock;
      pEVar7->expr = pEVar6->expr;
      pEVar7->clock = pTVar2;
      pEVar7 = pEVar7 + 1;
    }
    memcpy((void *)((long)pEVar4 + lVar8 + 0x18),pos,((lVar5 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar9 = this->len;
  }
  this->len = sVar9 + 1;
  this->cap = uVar10;
  this->data_ = pEVar4;
  return (pointer)((long)pEVar4 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}